

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# XMLUri.cpp
# Opt level: O0

void __thiscall xercesc_4_0::XMLUri::initializePath(XMLUri *this,XMLCh *uriSpec)

{
  bool bVar1;
  int iVar2;
  MalformedURLException *pMVar3;
  XMLSize_t XVar4;
  XMLCh *pXVar5;
  undefined4 extraout_var;
  XMLSize_t startIndex;
  undefined4 extraout_var_00;
  ulong startIndex_00;
  undefined4 extraout_var_01;
  XMLCh local_8a [4];
  XMLCh value1_11 [2];
  XMLCh value1_10 [4];
  XMLCh value1_9 [3];
  XMLCh value1_8 [2];
  XMLCh value1_7 [4];
  XMLCh value1_6 [3];
  XMLCh value1_5 [2];
  XMLCh value1_4 [4];
  XMLCh value1_3 [3];
  XMLCh value1_2 [2];
  XMLCh value1_1 [4];
  XMLCh value1 [3];
  XMLCh testChar;
  XMLSize_t end;
  XMLSize_t start;
  XMLSize_t index;
  XMLCh *uriSpec_local;
  XMLUri *this_local;
  
  if (uriSpec == (XMLCh *)0x0) {
    pMVar3 = (MalformedURLException *)__cxa_allocate_exception(0x30);
    MalformedURLException::MalformedURLException
              (pMVar3,
               "/workspace/llm4binary/github/license_c_cmakelists/apache[P]xerces-c/src/xercesc/util/XMLUri.cpp"
               ,0x341,XMLNUM_URI_Component_Empty,(XMLCh *)errMsg_PATH,(XMLCh *)0x0,(XMLCh *)0x0,
               (XMLCh *)0x0,this->fMemoryManager);
    __cxa_throw(pMVar3,&MalformedURLException::typeinfo,
                MalformedURLException::~MalformedURLException);
  }
  start = 0;
  XVar4 = XMLString::stringLen(uriSpec);
  value1_1[3] = L'\0';
  if (XVar4 != 0) {
    pXVar5 = getScheme(this);
    if ((pXVar5 == (XMLCh *)0x0) || (*uriSpec == L'/')) {
      for (; (start < XVar4 &&
             ((value1_1[3] = uriSpec[start], value1_1[3] != L'?' && (value1_1[3] != L'#'))));
          start = start + 1) {
        if (value1_1[3] == L'%') {
          if (XVar4 <= start + 2) {
            value1_1[1] = L'\0';
            value1_1[2] = L'\0';
            XMLString::moveChars(value1_1,uriSpec + start,(ulong)(start + 1 < XVar4) + 1);
            pMVar3 = (MalformedURLException *)__cxa_allocate_exception(0x30);
            MalformedURLException::MalformedURLException
                      (pMVar3,
                       "/workspace/llm4binary/github/license_c_cmakelists/apache[P]xerces-c/src/xercesc/util/XMLUri.cpp"
                       ,0x367,XMLNUM_URI_Component_Invalid_EscapeSequence,(XMLCh *)errMsg_PATH,
                       value1_1,(XMLCh *)0x0,(XMLCh *)0x0,this->fMemoryManager);
            __cxa_throw(pMVar3,&MalformedURLException::typeinfo,
                        MalformedURLException::~MalformedURLException);
          }
          bVar1 = XMLString::isHex(uriSpec[start + 1]);
          if ((!bVar1) || (bVar1 = XMLString::isHex(uriSpec[start + 2]), !bVar1)) {
            XMLString::moveChars(value1_3 + 1,uriSpec + start,3);
            pMVar3 = (MalformedURLException *)__cxa_allocate_exception(0x30);
            MalformedURLException::MalformedURLException
                      (pMVar3,
                       "/workspace/llm4binary/github/license_c_cmakelists/apache[P]xerces-c/src/xercesc/util/XMLUri.cpp"
                       ,0x372,XMLNUM_URI_Component_Invalid_EscapeSequence,(XMLCh *)errMsg_PATH,
                       value1_3 + 1,(XMLCh *)0x0,(XMLCh *)0x0,this->fMemoryManager);
            __cxa_throw(pMVar3,&MalformedURLException::typeinfo,
                        MalformedURLException::~MalformedURLException);
          }
        }
        else {
          bVar1 = isUnreservedCharacter(value1_1[3]);
          if ((!bVar1) && (bVar1 = isPathCharacter(value1_1[3]), !bVar1)) {
            value1_4[3] = value1_1[3];
            value1_3[0] = L'\0';
            pMVar3 = (MalformedURLException *)__cxa_allocate_exception(0x30);
            MalformedURLException::MalformedURLException
                      (pMVar3,
                       "/workspace/llm4binary/github/license_c_cmakelists/apache[P]xerces-c/src/xercesc/util/XMLUri.cpp"
                       ,0x37f,XMLNUM_URI_Component_Invalid_Char,(XMLCh *)errMsg_PATH,value1_4 + 3,
                       (XMLCh *)0x0,(XMLCh *)0x0,this->fMemoryManager);
            __cxa_throw(pMVar3,&MalformedURLException::typeinfo,
                        MalformedURLException::~MalformedURLException);
          }
        }
      }
    }
    else {
      for (; ((start < XVar4 && (value1_1[3] = uriSpec[start], value1_1[3] != L'?')) &&
             (value1_1[3] != L'#')); start = start + 1) {
        if (value1_1[3] == L'%') {
          if (XVar4 <= start + 2) {
            value1_4[1] = L'\0';
            value1_4[2] = L'\0';
            XMLString::moveChars(value1_4,uriSpec + start,(ulong)(start + 1 < XVar4) + 1);
            pMVar3 = (MalformedURLException *)__cxa_allocate_exception(0x30);
            MalformedURLException::MalformedURLException
                      (pMVar3,
                       "/workspace/llm4binary/github/license_c_cmakelists/apache[P]xerces-c/src/xercesc/util/XMLUri.cpp"
                       ,0x39e,XMLNUM_URI_Component_Invalid_EscapeSequence,(XMLCh *)errMsg_PATH,
                       value1_4,(XMLCh *)0x0,(XMLCh *)0x0,this->fMemoryManager);
            __cxa_throw(pMVar3,&MalformedURLException::typeinfo,
                        MalformedURLException::~MalformedURLException);
          }
          bVar1 = XMLString::isHex(uriSpec[start + 1]);
          if ((!bVar1) || (bVar1 = XMLString::isHex(uriSpec[start + 2]), !bVar1)) {
            XMLString::moveChars(value1_6 + 1,uriSpec + start,3);
            pMVar3 = (MalformedURLException *)__cxa_allocate_exception(0x30);
            MalformedURLException::MalformedURLException
                      (pMVar3,
                       "/workspace/llm4binary/github/license_c_cmakelists/apache[P]xerces-c/src/xercesc/util/XMLUri.cpp"
                       ,0x3a9,XMLNUM_URI_Component_Invalid_EscapeSequence,(XMLCh *)errMsg_PATH,
                       value1_6 + 1,(XMLCh *)0x0,(XMLCh *)0x0,this->fMemoryManager);
            __cxa_throw(pMVar3,&MalformedURLException::typeinfo,
                        MalformedURLException::~MalformedURLException);
          }
        }
        else {
          bVar1 = isReservedOrUnreservedCharacter(value1_1[3]);
          if (!bVar1) {
            value1_7[3] = value1_1[3];
            value1_6[0] = L'\0';
            pMVar3 = (MalformedURLException *)__cxa_allocate_exception(0x30);
            MalformedURLException::MalformedURLException
                      (pMVar3,
                       "/workspace/llm4binary/github/license_c_cmakelists/apache[P]xerces-c/src/xercesc/util/XMLUri.cpp"
                       ,0x3ba,XMLNUM_URI_Component_Invalid_Char,(XMLCh *)errMsg_PATH,value1_7 + 3,
                       (XMLCh *)0x0,(XMLCh *)0x0,this->fMemoryManager);
            __cxa_throw(pMVar3,&MalformedURLException::typeinfo,
                        MalformedURLException::~MalformedURLException);
          }
        }
      }
    }
  }
  pXVar5 = getPath(this);
  if (pXVar5 != (XMLCh *)0x0) {
    (*this->fMemoryManager->_vptr_MemoryManager[4])(this->fMemoryManager,this->fPath);
  }
  iVar2 = (*this->fMemoryManager->_vptr_MemoryManager[3])(this->fMemoryManager,(start + 1) * 2);
  this->fPath = (XMLCh *)CONCAT44(extraout_var,iVar2);
  XMLString::subString(this->fPath,uriSpec,0,start,this->fMemoryManager);
  if (value1_1[3] == L'?') {
    startIndex = start + 1;
    for (start = startIndex; (start < XVar4 && (value1_1[3] = uriSpec[start], value1_1[3] != L'#'));
        start = start + 1) {
      if (value1_1[3] == L'%') {
        if (XVar4 <= start + 2) {
          value1_7[1] = L'\0';
          value1_7[2] = L'\0';
          XMLString::moveChars(value1_7,uriSpec + start,(ulong)(start + 1 < XVar4) + 1);
          pMVar3 = (MalformedURLException *)__cxa_allocate_exception(0x30);
          MalformedURLException::MalformedURLException
                    (pMVar3,
                     "/workspace/llm4binary/github/license_c_cmakelists/apache[P]xerces-c/src/xercesc/util/XMLUri.cpp"
                     ,0x3e3,XMLNUM_URI_Component_Invalid_EscapeSequence,(XMLCh *)errMsg_QUERY,
                     value1_7,(XMLCh *)0x0,(XMLCh *)0x0,this->fMemoryManager);
          __cxa_throw(pMVar3,&MalformedURLException::typeinfo,
                      MalformedURLException::~MalformedURLException);
        }
        bVar1 = XMLString::isHex(uriSpec[start + 1]);
        if ((!bVar1) || (bVar1 = XMLString::isHex(uriSpec[start + 2]), !bVar1)) {
          XMLString::moveChars(value1_9 + 1,uriSpec + start,3);
          pMVar3 = (MalformedURLException *)__cxa_allocate_exception(0x30);
          MalformedURLException::MalformedURLException
                    (pMVar3,
                     "/workspace/llm4binary/github/license_c_cmakelists/apache[P]xerces-c/src/xercesc/util/XMLUri.cpp"
                     ,0x3ee,XMLNUM_URI_Component_Invalid_EscapeSequence,(XMLCh *)errMsg_QUERY,
                     value1_9 + 1,(XMLCh *)0x0,(XMLCh *)0x0,this->fMemoryManager);
          __cxa_throw(pMVar3,&MalformedURLException::typeinfo,
                      MalformedURLException::~MalformedURLException);
        }
      }
      else {
        bVar1 = isReservedOrUnreservedCharacter(value1_1[3]);
        if (!bVar1) {
          value1_10[3] = value1_1[3];
          value1_9[0] = L'\0';
          pMVar3 = (MalformedURLException *)__cxa_allocate_exception(0x30);
          MalformedURLException::MalformedURLException
                    (pMVar3,
                     "/workspace/llm4binary/github/license_c_cmakelists/apache[P]xerces-c/src/xercesc/util/XMLUri.cpp"
                     ,0x3fa,XMLNUM_URI_Component_Invalid_Char,(XMLCh *)errMsg_QUERY,value1_10 + 3,
                     (XMLCh *)0x0,(XMLCh *)0x0,this->fMemoryManager);
          __cxa_throw(pMVar3,&MalformedURLException::typeinfo,
                      MalformedURLException::~MalformedURLException);
        }
      }
    }
    pXVar5 = getQueryString(this);
    if (pXVar5 != (XMLCh *)0x0) {
      (*this->fMemoryManager->_vptr_MemoryManager[4])(this->fMemoryManager,this->fQueryString);
    }
    iVar2 = (*this->fMemoryManager->_vptr_MemoryManager[3])
                      (this->fMemoryManager,((start - startIndex) + 1) * 2);
    this->fQueryString = (XMLCh *)CONCAT44(extraout_var_00,iVar2);
    XMLString::subString(this->fQueryString,uriSpec,startIndex,start,this->fMemoryManager);
  }
  if (value1_1[3] == L'#') {
    startIndex_00 = start + 1;
    for (start = startIndex_00; start < XVar4; start = start + 1) {
      value1_1[3] = uriSpec[start];
      if (value1_1[3] == L'%') {
        if (XVar4 <= start + 2) {
          value1_10[1] = L'\0';
          value1_10[2] = L'\0';
          XMLString::moveChars(value1_10,uriSpec + start,(ulong)(start + 1 < XVar4) + 1);
          pMVar3 = (MalformedURLException *)__cxa_allocate_exception(0x30);
          MalformedURLException::MalformedURLException
                    (pMVar3,
                     "/workspace/llm4binary/github/license_c_cmakelists/apache[P]xerces-c/src/xercesc/util/XMLUri.cpp"
                     ,0x420,XMLNUM_URI_Component_Invalid_EscapeSequence,(XMLCh *)errMsg_FRAGMENT,
                     value1_10,(XMLCh *)0x0,(XMLCh *)0x0,this->fMemoryManager);
          __cxa_throw(pMVar3,&MalformedURLException::typeinfo,
                      MalformedURLException::~MalformedURLException);
        }
        bVar1 = XMLString::isHex(uriSpec[start + 1]);
        if ((!bVar1) || (bVar1 = XMLString::isHex(uriSpec[start + 2]), !bVar1)) {
          XMLString::moveChars(local_8a + 2,uriSpec + start,3);
          value1_11[1] = L'\0';
          pMVar3 = (MalformedURLException *)__cxa_allocate_exception(0x30);
          MalformedURLException::MalformedURLException
                    (pMVar3,
                     "/workspace/llm4binary/github/license_c_cmakelists/apache[P]xerces-c/src/xercesc/util/XMLUri.cpp"
                     ,0x42b,XMLNUM_URI_Component_Invalid_EscapeSequence,(XMLCh *)errMsg_FRAGMENT,
                     local_8a + 2,(XMLCh *)0x0,(XMLCh *)0x0,this->fMemoryManager);
          __cxa_throw(pMVar3,&MalformedURLException::typeinfo,
                      MalformedURLException::~MalformedURLException);
        }
      }
      else {
        bVar1 = isReservedOrUnreservedCharacter(value1_1[3]);
        if (!bVar1) {
          local_8a[0] = value1_1[3];
          local_8a[1] = 0;
          pMVar3 = (MalformedURLException *)__cxa_allocate_exception(0x30);
          MalformedURLException::MalformedURLException
                    (pMVar3,
                     "/workspace/llm4binary/github/license_c_cmakelists/apache[P]xerces-c/src/xercesc/util/XMLUri.cpp"
                     ,0x437,XMLNUM_URI_Component_Invalid_Char,(XMLCh *)errMsg_FRAGMENT,local_8a,
                     (XMLCh *)0x0,(XMLCh *)0x0,this->fMemoryManager);
          __cxa_throw(pMVar3,&MalformedURLException::typeinfo,
                      MalformedURLException::~MalformedURLException);
        }
      }
    }
    pXVar5 = getFragment(this);
    if (pXVar5 != (XMLCh *)0x0) {
      (*this->fMemoryManager->_vptr_MemoryManager[4])(this->fMemoryManager,this->fFragment);
    }
    if (startIndex_00 < start) {
      iVar2 = (*this->fMemoryManager->_vptr_MemoryManager[3])
                        (this->fMemoryManager,((start - startIndex_00) + 1) * 2);
      this->fFragment = (XMLCh *)CONCAT44(extraout_var_01,iVar2);
      XMLString::subString(this->fFragment,uriSpec,startIndex_00,start,this->fMemoryManager);
    }
    else {
      this->fFragment = (XMLCh *)0x0;
    }
  }
  return;
}

Assistant:

void XMLUri::initializePath(const XMLCh* const uriSpec)
{
    if ( !uriSpec )
    {
        ThrowXMLwithMemMgr1(MalformedURLException
                , XMLExcepts::XMLNUM_URI_Component_Empty
                , errMsg_PATH
                , fMemoryManager);
    }

    XMLSize_t index = 0;
    XMLSize_t start = 0;
    XMLSize_t end = XMLString::stringLen(uriSpec);
    XMLCh testChar = 0;

    // path - everything up to query string or fragment
    if (start < end)
    {
        // RFC 2732 only allows '[' and ']' to appear in the opaque part.
        if (!getScheme() || uriSpec[start] == chForwardSlash)
        {
            // Scan path.
            // abs_path = "/"  path_segments
            // rel_path = rel_segment [ abs_path ]
            while (index < end)
            {
                testChar = uriSpec[index];
                if (testChar == chQuestion || testChar == chPound)
                {
                    break;
                }

                // check for valid escape sequence
                if (testChar == chPercent)
                {
                    if (index + 2 >= end)
                    {
                        XMLCh value1[3];
                        value1[1] = chNull;
                        value1[2] = chNull;
                        XMLString::moveChars(value1, &(uriSpec[index]), (index + 1 >= end ? 1 : 2));
                        ThrowXMLwithMemMgr2(MalformedURLException
                            , XMLExcepts::XMLNUM_URI_Component_Invalid_EscapeSequence
                            , errMsg_PATH
                            , value1
                            , fMemoryManager);
                    }
                    else if (!XMLString::isHex(uriSpec[index+1]) || !XMLString::isHex(uriSpec[index+2]))
                    {
                        XMLCh value1[4];
                        XMLString::moveChars(value1, &(uriSpec[index]), 3);
                        value1[3] = chNull;
                        ThrowXMLwithMemMgr2(MalformedURLException
                                , XMLExcepts::XMLNUM_URI_Component_Invalid_EscapeSequence
                                , errMsg_PATH
                                , value1
                                , fMemoryManager);
                    }
                }
                else if (!isUnreservedCharacter(testChar) &&
                         !isPathCharacter(testChar))
                {
                    XMLCh value1[2];
                    value1[0] = testChar;
                    value1[1] = chNull;
                    ThrowXMLwithMemMgr2(MalformedURLException
                            , XMLExcepts::XMLNUM_URI_Component_Invalid_Char
                            , errMsg_PATH
                            , value1
                            , fMemoryManager);
                }

                index++;
            }//while (index < end)
        }
        else
        {
            // Scan opaque part.
            // opaque_part = uric_no_slash *uric
            while (index < end)
            {
                testChar = uriSpec[index];
                if (testChar == chQuestion || testChar == chPound)
                {
                    break;
                }

                // check for valid escape sequence
                if (testChar == chPercent)
                {
                    if (index + 2 >= end)
                    {
                        XMLCh value1[3];
                        value1[1] = chNull;
                        value1[2] = chNull;
                        XMLString::moveChars(value1, &(uriSpec[index]), (index + 1 >= end ? 1 : 2));
                        ThrowXMLwithMemMgr2(MalformedURLException
                            , XMLExcepts::XMLNUM_URI_Component_Invalid_EscapeSequence
                            , errMsg_PATH
                            , value1
                            , fMemoryManager);
                    }
                    else if (!XMLString::isHex(uriSpec[index+1]) || !XMLString::isHex(uriSpec[index+2]))
                    {
                        XMLCh value1[4];
                        XMLString::moveChars(value1, &(uriSpec[index]), 3);
                        value1[3] = chNull;
                        ThrowXMLwithMemMgr2(MalformedURLException
                                , XMLExcepts::XMLNUM_URI_Component_Invalid_EscapeSequence
                                , errMsg_PATH
                                , value1
                                , fMemoryManager);
                    }
                }
                // If the scheme specific part is opaque, it can contain '['
                // and ']'. uric_no_slash wasn't modified by RFC 2732, which
                // I've interpreted as an error in the spec, since the
                // production should be equivalent to (uric - '/'), and uric
                // contains '[' and ']'.
                else if (!isReservedOrUnreservedCharacter(testChar))
                {
                    XMLCh value1[2];
                    value1[0] = testChar;
                    value1[1] = chNull;
                    ThrowXMLwithMemMgr2(MalformedURLException
                            , XMLExcepts::XMLNUM_URI_Component_Invalid_Char
                            , errMsg_PATH
                            , value1
                            , fMemoryManager);
                }

                index++;
            }//while (index < end)
        }
    } //if (start < end)

    if (getPath())
    {
        fMemoryManager->deallocate(fPath);//delete [] fPath;
    }

    fPath = (XMLCh*) fMemoryManager->allocate((index+1) * sizeof(XMLCh));//new XMLCh[index+1];
    XMLString::subString(fPath, uriSpec, start, index, fMemoryManager);

    // query - starts with ? and up to fragment or end
    if (testChar == chQuestion)
    {
        index++;
        start = index;
        while (index < end)
        {
            testChar = uriSpec[index];
            if (testChar == chPound)
            {
                break;
            }

            if (testChar == chPercent)
            {
                if (index + 2 >= end)
                {
                    XMLCh value1[3];
                    value1[1] = chNull;
                    value1[2] = chNull;
                    XMLString::moveChars(value1, &(uriSpec[index]), (index + 1 >= end ? 1 : 2));
                    ThrowXMLwithMemMgr2(MalformedURLException
                        , XMLExcepts::XMLNUM_URI_Component_Invalid_EscapeSequence
                        , errMsg_QUERY
                        , value1
                        , fMemoryManager);
                }
                if (!XMLString::isHex(uriSpec[index+1]) || !XMLString::isHex(uriSpec[index+2]))
                {
                    XMLCh value1[4];
                    XMLString::moveChars(value1, &(uriSpec[index]), 3);
                    value1[3] = chNull;
                    ThrowXMLwithMemMgr2(MalformedURLException
                            , XMLExcepts::XMLNUM_URI_Component_Invalid_EscapeSequence
                            , errMsg_QUERY
                            , value1
                            , fMemoryManager);
                }
            }
            else if (!isReservedOrUnreservedCharacter(testChar))
            {
                XMLCh value1[2];
                value1[0] = testChar;
                value1[1] = chNull;
                ThrowXMLwithMemMgr2(MalformedURLException
                        , XMLExcepts::XMLNUM_URI_Component_Invalid_Char
                        , errMsg_QUERY
                        , value1
                        , fMemoryManager);
            }
            index++;
        }

        if (getQueryString())
        {
            fMemoryManager->deallocate(fQueryString);//delete [] fQueryString;
        }

        fQueryString = (XMLCh*) fMemoryManager->allocate
        (
            (index - start + 1) * sizeof(XMLCh)
        );//new XMLCh[index - start + 1];
        XMLString::subString(fQueryString, uriSpec, start, index, fMemoryManager);
    }

    // fragment - starts with #
    if (testChar == chPound)
    {
        index++;
        start = index;
        while (index < end)
        {
            testChar = uriSpec[index];

            if (testChar == chPercent)
            {
                if (index + 2 >= end)
                {
                    XMLCh value1[3];
                    value1[1] = chNull;
                    value1[2] = chNull;
                    XMLString::moveChars(value1, &(uriSpec[index]), (index + 1 >= end ? 1 : 2));
                    ThrowXMLwithMemMgr2(MalformedURLException
                        , XMLExcepts::XMLNUM_URI_Component_Invalid_EscapeSequence
                        , errMsg_FRAGMENT
                        , value1
                        , fMemoryManager);
                }
                if (!XMLString::isHex(uriSpec[index+1]) || !XMLString::isHex(uriSpec[index+2]))
                {
                    XMLCh value1[4];
                    XMLString::moveChars(value1, &(uriSpec[index]), 3);
                    value1[3] = chNull;
                    ThrowXMLwithMemMgr2(MalformedURLException
                            , XMLExcepts::XMLNUM_URI_Component_Invalid_EscapeSequence
                            , errMsg_FRAGMENT
                            , value1
                            , fMemoryManager);
                }
            }
            else if (!isReservedOrUnreservedCharacter(testChar))
            {
                XMLCh value1[2];
                value1[0] = testChar;
                value1[1] = chNull;
                ThrowXMLwithMemMgr2(MalformedURLException
                        , XMLExcepts::XMLNUM_URI_Component_Invalid_Char
                        , errMsg_FRAGMENT
                        , value1
                        , fMemoryManager);
            }

            index++;

        }

        if (getFragment())
            fMemoryManager->deallocate(fFragment);//delete [] fFragment;

        //make sure that there is something following the '#'
        if (index > start)
        {
            fFragment = (XMLCh*) fMemoryManager->allocate
            (
                (index - start + 1) * sizeof(XMLCh)
            );//new XMLCh[index - start + 1];
            XMLString::subString(fFragment, uriSpec, start, index, fMemoryManager);
        }
        else
        {
            // RFC 2396, 4.0. URI Reference
            // URI-reference = [absoulteURI | relativeURI] [# fragment]
            //
            // RFC 2396, 4.1. Fragment Identifier
            // fragment = *uric
            //
            // empty fragment is valid
            fFragment = 0;
        }
    }

}